

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::ParseableFunctionInfo::ParseableFunctionInfo
          (ParseableFunctionInfo *this,ParseableFunctionInfo *proxy)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Recycler *alloc;
  NestedArray *pNVar8;
  undefined4 extraout_var;
  ushort uVar9;
  ushort uVar10;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  FunctionProxy::FunctionProxy
            (&this->super_FunctionProxy,(proxy->super_FunctionProxy).m_scriptContext,
             (proxy->super_FunctionProxy).m_utf8SourceInfo.ptr,
             (proxy->super_FunctionProxy).m_functionNumber);
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013771d0;
  uVar4 = (*(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xfffc) + 1;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 = uVar4;
  uVar9 = *(ushort *)&(proxy->super_FunctionProxy).field_0x45 & 0x10;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 = uVar4 & 0xffed | uVar9;
  uVar10 = *(ushort *)&(proxy->super_FunctionProxy).field_0x45 & 0x20;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 = uVar4 & 0xffcd | uVar9 | uVar10;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       uVar4 & 0xff8d | uVar9 | uVar10 | *(ushort *)&(proxy->super_FunctionProxy).field_0x45 & 0x40;
  bVar2 = (proxy->super_FunctionProxy).field_0x47 & 0x10;
  bVar1 = (this->super_FunctionProxy).field_0x47;
  (this->super_FunctionProxy).field_0x47 = bVar1 & 0xef | bVar2;
  bVar3 = (proxy->super_FunctionProxy).field_0x47 & 0x20;
  (this->super_FunctionProxy).field_0x47 = bVar1 & 0xcf | bVar2 | bVar3;
  (this->super_FunctionProxy).field_0x47 =
       bVar1 & 0x8f | bVar2 | bVar3 | (proxy->super_FunctionProxy).field_0x47 & 0x40;
  this->m_reportedInParamCount = proxy->m_reportedInParamCount;
  (this->m_displayName).ptr = (char16_t *)0x0;
  (this->nestedArray).ptr = (NestedArray *)0x0;
  (this->crossSiteUndeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  this->m_dynamicInterpreterThunk = (Type)0x0;
  (this->crossSiteDeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierSet
            (&(this->super_FunctionProxy).functionInfo,(proxy->super_FunctionProxy).functionInfo.ptr
            );
  pNVar8 = (proxy->nestedArray).ptr;
  if (pNVar8 != (NestedArray *)0x0) {
    uVar6 = pNVar8->nestedCount;
    if ((ulong)uVar6 != 0) {
      data.typeinfo = (type_info *)((ulong)uVar6 << 3);
      local_58 = (undefined1  [8])&NestedArray::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_29f156b;
      data.filename._0_4_ = 0x6c2;
      alloc = Memory::Recycler::TrackAllocInfo
                        (((this->super_FunctionProxy).m_scriptContext)->recycler,
                         (TrackAllocData *)local_58);
      pNVar8 = (NestedArray *)new<Memory::Recycler>(8,alloc,0x398e98,0);
      pNVar8->nestedCount = uVar6;
      Memory::WriteBarrierPtr<Js::ParseableFunctionInfo::NestedArray>::WriteBarrierSet
                (&this->nestedArray,pNVar8);
      goto LAB_006c6a98;
    }
  }
  (this->nestedArray).ptr = (NestedArray *)0x0;
LAB_006c6a98:
  Copy(proxy,this);
  iVar5 = (*(proxy->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(proxy);
  uVar6 = (*(proxy->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[8])(proxy);
  uVar7 = (*(proxy->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[9])(proxy);
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])(this,CONCAT44(extraout_var,iVar5),(ulong)uVar6,(ulong)uVar7,0);
  return;
}

Assistant:

ParseableFunctionInfo::ParseableFunctionInfo(ParseableFunctionInfo * proxy) :
      FunctionProxy(proxy->GetScriptContext(), proxy->GetUtf8SourceInfo(), proxy->GetFunctionNumber()),
#if DYNAMIC_INTERPRETER_THUNK
      m_dynamicInterpreterThunk(nullptr),
#endif
      m_hasBeenParsed(false),
      m_isNamedFunctionExpression(proxy->GetIsNamedFunctionExpression()),
      m_isNameIdentifierRef (proxy->GetIsNameIdentifierRef()),
      m_isStaticNameFunction(proxy->GetIsStaticNameFunction()),
      m_reportedInParamCount(proxy->GetReportedInParamsCount()),
      m_reparsed(proxy->IsReparsed()),
      m_isMethod(proxy->IsMethod()),
      m_tag21(true)
#if DBG
      , m_wasEverAsmjsMode(proxy->m_wasEverAsmjsMode)
#endif
    {
        FunctionInfo * functionInfo = proxy->GetFunctionInfo();
        this->functionInfo = functionInfo;

        uint nestedCount = proxy->GetNestedCount();
        if (nestedCount > 0)
        {
            nestedArray = RecyclerNewPlusZ(m_scriptContext->GetRecycler(),
                nestedCount*sizeof(FunctionProxy*), NestedArray, nestedCount);
        }
        else
        {
            nestedArray = nullptr;
        }

        proxy->Copy(this);

        SetDisplayName(proxy->GetDisplayName(), proxy->GetDisplayNameLength(), proxy->GetShortDisplayNameOffset());
    }